

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O2

bool __thiscall cfd::core::Psbt::IsFindTxOutRecord(Psbt *this,uint32_t index,ByteData *key)

{
  undefined4 in_register_00000034;
  bool is_find;
  bool local_39;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  
  (*this->_vptr_Psbt[3])(this,CONCAT44(in_register_00000034,index),0xc36,"IsFindTxOutRecord");
  local_39 = false;
  GetPsbtOutput((ByteData *)&local_38,key,
                (wally_psbt_output *)
                ((ulong)index * 0xd0 + *(long *)((long)this->wally_psbt_pointer_ + 0x28)),&local_39)
  ;
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_38);
  return local_39;
}

Assistant:

bool Psbt::IsFindTxOutRecord(uint32_t index, const ByteData &key) const {
  CheckTxOutIndex(index, __LINE__, __FUNCTION__);
  struct wally_psbt *psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt *>(wally_psbt_pointer_);
  bool is_find = false;
  GetPsbtOutput(key, &psbt_pointer->outputs[index], &is_find);
  return is_find;
}